

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_utils.cc
# Opt level: O2

void printTable(ostream *oss,
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *to_be_printed)

{
  pointer pbVar1;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *row;
  pointer pvVar3;
  pointer pvVar4;
  size_type *psVar5;
  ulong uVar6;
  size_type __n;
  long lVar7;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  allocator_type local_71;
  pointer local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> column_width;
  string s;
  
  __n = 0;
  for (pvVar3 = (to_be_printed->
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar3 != (to_be_printed->
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pvVar3 = pvVar3 + 1) {
    uVar6 = (long)(pvVar3->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar3->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    if (__n <= uVar6) {
      __n = uVar6;
    }
  }
  s._M_dataplus._M_p = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&column_width,__n,(value_type_conflict2 *)&s,&local_71);
  local_70 = (to_be_printed->
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (to_be_printed->
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (pvVar4 = pvVar3; pvVar4 != local_70; pvVar4 = pvVar4 + 1) {
    pbVar1 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    psVar5 = &pbVar1->_M_string_length;
    for (lVar7 = 0; (long)pbVar2 - (long)pbVar1 >> 5 != lVar7; lVar7 = lVar7 + 1) {
      uVar6 = *psVar5;
      if (*psVar5 < column_width.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar7]) {
        uVar6 = column_width.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar7];
      }
      column_width.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = uVar6;
      psVar5 = psVar5 + 4;
    }
  }
  for (; pvVar3 != local_70; pvVar3 = pvVar3 + 1) {
    lVar7 = 0;
    for (uVar6 = 0;
        pbVar1 = (pvVar3->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(pvVar3->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar6 = uVar6 + 1) {
      std::__cxx11::string::string
                ((string *)&s,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7));
      if (uVar6 < ((long)(pvVar3->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar3->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
        std::__cxx11::string::append
                  ((ulong)&s,
                   (char)column_width.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6] - (char)s._M_string_length);
        std::__cxx11::string::push_back((char)&s);
      }
      std::operator<<(oss,(string *)&s);
      std::__cxx11::string::~string((string *)&s);
      lVar7 = lVar7 + 0x20;
    }
    std::operator<<(oss,'\n');
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&column_width.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void printTable(std::ostream &oss,
                const std::vector<std::vector<std::string>> &to_be_printed)
{
  std::size_t max_columns = 0;
  for (const auto &row : to_be_printed)
  {
    max_columns = std::max(max_columns, row.size());
  }

  std::vector<std::size_t> column_width(max_columns, 0);
  for (const auto &row : to_be_printed)
  {
    for (std::size_t col = 0; col < row.size(); ++col)
    {
      column_width[col] = std::max(column_width[col], row[col].size());
    }
  }

  for (const auto &row : to_be_printed)
  {
    for (std::size_t col = 0; col < row.size(); ++col)
    {
      std::string s = row[col];
      if (col < row.size() - 1)
      {
        s.append(column_width[col] - s.length(), ' ');
        s += '\t';
      }
      oss << s;
    }
    oss << '\n';
  }
}